

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddCompositeExtract
          (InstructionBuilder *this,uint32_t type,uint32_t id_of_composite,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *index_list)

{
  pointer puVar1;
  IRContext *this_00;
  InstructionBuilder *this_01;
  uint32_t res_id;
  Instruction *pIVar2;
  pointer puVar3;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint local_b8;
  uint32_t local_b4;
  InstructionBuilder *local_b0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> operands;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  init_list._M_len = 1;
  init_list._M_array = &local_b8;
  local_b8 = id_of_composite;
  local_b4 = type;
  local_b0 = this;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
  local_88.type = SPV_OPERAND_TYPE_ID;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
  emplace_back<spvtools::opt::Operand>(&operands,&local_88);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  puVar1 = (index_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (index_list->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    local_b8 = *puVar3;
    init_list_00._M_len = 1;
    init_list_00._M_array = &local_b8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list_00);
    local_88.type = SPV_OPERAND_TYPE_LITERAL_INTEGER;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
    emplace_back<spvtools::opt::Operand>(&operands,&local_88);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
  }
  pIVar2 = (Instruction *)::operator_new(0x70);
  this_01 = local_b0;
  this_00 = local_b0->context_;
  res_id = IRContext::TakeNextId(this_00);
  Instruction::Instruction(pIVar2,this_00,OpCompositeExtract,local_b4,res_id,&operands);
  local_88._0_8_ = pIVar2;
  pIVar2 = AddInstruction(this_01,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                   *)&local_88);
  if ((Instruction *)local_88._0_8_ != (Instruction *)0x0) {
    (*((IntrusiveNodeBase<spvtools::opt::Instruction> *)local_88._0_8_)->_vptr_IntrusiveNodeBase[1])
              ();
  }
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&operands);
  return pIVar2;
}

Assistant:

Instruction* AddCompositeExtract(uint32_t type, uint32_t id_of_composite,
                                   const std::vector<uint32_t>& index_list) {
    std::vector<Operand> operands;
    operands.push_back({SPV_OPERAND_TYPE_ID, {id_of_composite}});

    for (uint32_t index : index_list) {
      operands.push_back({SPV_OPERAND_TYPE_LITERAL_INTEGER, {index}});
    }

    // TODO(1841): Handle id overflow.
    std::unique_ptr<Instruction> new_inst(
        new Instruction(GetContext(), spv::Op::OpCompositeExtract, type,
                        GetContext()->TakeNextId(), operands));
    return AddInstruction(std::move(new_inst));
  }